

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.h
# Opt level: O1

int MatchSyntaxPattern(KonohaContext *kctx,kNode *node,KTokenSeq *tokens,KTokenSeq *patterns,
                      kToken **errRuleRef)

{
  uint uVar1;
  KClass *pKVar2;
  kToken *pkVar3;
  int iVar4;
  kSyntax *syn;
  kNameSpace *pkVar5;
  long lVar6;
  byte bVar7;
  int beginIdx;
  kNameSpace *pkVar8;
  int iVar9;
  int iVar10;
  kToken *pkVar11;
  int local_c4;
  KTokenSeq nrule;
  KTokenSeq ntokens;
  
  iVar10 = patterns->beginIdx;
  beginIdx = tokens->beginIdx;
  pKVar2 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
  pkVar5 = (kNameSpace *)node;
  do {
    pkVar8 = ((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar5->importedNameSpaceList)->
             StmtNameSpace;
    if ((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar5->importedNameSpaceList)->StmtNameSpace->
        h).ct == pKVar2) break;
    pkVar5 = ((anon_union_8_2_7d56b7f0_for_kNodeVar_3 *)&pkVar5->packageId)->RootNodeNameSpace;
    pkVar8 = pkVar5;
  } while ((pkVar5->h).ct != pKVar2);
  if (patterns->endIdx <= iVar10) {
    return beginIdx;
  }
LAB_00118bf6:
  pkVar11 = (kToken *)(patterns->tokenList->field_2).unboxItems[iVar10];
  do {
    if (tokens->endIdx <= beginIdx) {
      iVar4 = patterns->endIdx;
      bVar7 = 1;
      local_c4 = beginIdx;
      if (iVar10 + 1 < iVar4) {
        lVar6 = (long)(iVar10 + 1);
        iVar9 = iVar10;
        goto LAB_00118e49;
      }
      break;
    }
    pkVar3 = (kToken *)(tokens->tokenList->field_2).unboxItems[beginIdx];
    errRuleRef[1] = pkVar3;
    uVar1 = pkVar11->symbol;
    if (uVar1 < 0xe0000000) {
      if (uVar1 == 0x60000008) {
        nrule.tokenList = (pkVar11->field_2).GroupTokenList;
        nrule.beginIdx = 1;
        nrule.endIdx = (int)((nrule.tokenList)->bytesize >> 3) + -1;
        nrule.field_4.SourceConfig.foundErrorToken = (kToken *)0x0;
        nrule.field_4.SourceConfig.openToken = (kToken *)0x0;
        nrule.field_4.TargetPolicy.syntaxSymbolPattern = (kSyntax *)0x0;
        tokens->beginIdx = beginIdx;
        nrule.ns = pkVar8;
        iVar4 = MatchSyntaxPattern(kctx,node,tokens,&nrule,errRuleRef);
        *errRuleRef = (kToken *)0x0;
        if (node->nodeType == 0x18) {
          local_c4 = tokens->endIdx;
        }
        else if (iVar4 != -1) {
          beginIdx = iVar4;
        }
        bVar7 = 1;
        if (node->nodeType != 0x18) goto LAB_00118dff;
      }
      else {
        if (uVar1 == pkVar3->symbol) {
          if ((pkVar11->field_3).tokenType - 7 < 2) {
            nrule.tokenList = (pkVar11->field_2).GroupTokenList;
            bVar7 = 1;
            nrule.beginIdx = 1;
            nrule.endIdx = (int)((nrule.tokenList)->bytesize >> 3) + -1;
            nrule.field_4.SourceConfig.foundErrorToken = (kToken *)0x0;
            nrule.field_4.SourceConfig.openToken = (kToken *)0x0;
            nrule.field_4.TargetPolicy.syntaxSymbolPattern = (kSyntax *)0x0;
            ntokens.tokenList = (pkVar3->field_2).GroupTokenList;
            ntokens.beginIdx = 1;
            ntokens.endIdx = (int)((ntokens.tokenList)->bytesize >> 3) + -1;
            ntokens.field_4.SourceConfig.foundErrorToken = (kToken *)0x0;
            ntokens.field_4.SourceConfig.openToken = (kToken *)0x0;
            ntokens.field_4.TargetPolicy.syntaxSymbolPattern = (kSyntax *)0x0;
            nrule.ns = pkVar8;
            ntokens.ns = pkVar8;
            iVar4 = MatchSyntaxPattern(kctx,node,&ntokens,&nrule,errRuleRef);
            if (iVar4 == -1) {
              local_c4 = -1;
              goto LAB_00118e0a;
            }
          }
          beginIdx = beginIdx + 1;
          goto LAB_00118dff;
        }
        *errRuleRef = pkVar11;
        local_c4 = -1;
        bVar7 = 1;
      }
    }
    else {
      syn = (*kctx->klib->kNameSpace_GetSyntax)(kctx,pkVar8,uVar1);
      iVar4 = ParseSyntaxNode(kctx,syn,node,(pkVar11->field_6).ruleNameSymbol,tokens->tokenList,
                              beginIdx,-1,tokens->endIdx);
      if (iVar4 == -1) {
        bVar7 = 4;
        if (((pkVar11->h).magicflag & 0x100) == 0) {
          *errRuleRef = pkVar11;
          local_c4 = -1;
          bVar7 = 1;
        }
      }
      else {
        bVar7 = 0;
        beginIdx = iVar4;
      }
      if (iVar4 != -1) {
LAB_00118dff:
        bVar7 = (*(byte *)((long)&(pkVar11->h).magicflag + 1) & 1) * '\x05';
      }
    }
LAB_00118e0a:
  } while (bVar7 == 5);
  goto LAB_00118e7d;
  while( true ) {
    pkVar11 = (kToken *)(patterns->tokenList->field_2).unboxItems[lVar6];
    lVar6 = lVar6 + 1;
    iVar9 = iVar9 + 1;
    iVar10 = iVar4 + -1;
    if (iVar4 == lVar6) break;
LAB_00118e49:
    if ((pkVar11->symbol != 0x60000008) && (((pkVar11->h).magicflag & 0x100) == 0)) {
      *errRuleRef = pkVar11;
      errRuleRef[1] = (kToken *)0x0;
      local_c4 = -1;
      iVar10 = iVar9;
      break;
    }
  }
LAB_00118e7d:
  if ((bVar7 & 3) != 0) {
    return local_c4;
  }
  iVar10 = iVar10 + 1;
  if (patterns->endIdx <= iVar10) {
    return beginIdx;
  }
  goto LAB_00118bf6;
}

Assistant:

static int MatchSyntaxPattern(KonohaContext *kctx, kNode *node, KTokenSeq *tokens, KTokenSeq *patterns, kToken **errRuleRef)
{
	int patternIdx = patterns->beginIdx, tokenIdx = tokens->beginIdx;
	kNameSpace *ns = kNode_ns(node);
	//KLIB dumpTokenArray(kctx, 0, patterns->tokenList, patterns->beginIdx, patterns->endIdx);
	//KLIB dumpTokenArray(kctx, 0, tokens->tokenList, tokens->beginIdx, tokens->endIdx);
	for(; patternIdx < patterns->endIdx; patternIdx++) {
		kToken *ruleToken = patterns->tokenList->TokenItems[patternIdx];
		L_ReDo:;
		//tokenIdx = TokenUtils_SkipOnlyIndent(tokens->tokenList, tokenIdx, tokens->endIdx);
		//DBG_P("patternIdx=%d, tokenIdx=%d, tokenEndIdx=%d", patternIdx, tokenIdx, tokens->endIdx);
		//KDump(node);
		if(tokenIdx < tokens->endIdx) {
			kToken *tk = tokens->tokenList->TokenItems[tokenIdx];
			errRuleRef[1] = tk;
			if(KSymbol_IsPattern(ruleToken->symbol)) {
				kSyntax *syn = kSyntax_(ns, ruleToken->symbol);
				int nextIdx = ParseSyntaxNode(kctx, syn, node, ruleToken->ruleNameSymbol, tokens->tokenList, tokenIdx, -1, tokens->endIdx);
				if(nextIdx == PatternNoMatch) {
					if(!kToken_Is(MatchPreviousPattern, ruleToken)) {
						errRuleRef[0] = ruleToken;
						return PatternNoMatch;
					}
					continue;  /* to avoid check same rule */
				}
				tokenIdx = nextIdx ;
			}
			else if(ruleToken->symbol == KSymbol_OptionalGroup) {
				KTokenSeq nrule = {ns, RangeGroup(ruleToken->GroupTokenList)};
				tokens->beginIdx = tokenIdx;
				int nextIdx = MatchSyntaxPattern(kctx, node, tokens, &nrule, errRuleRef);
				errRuleRef[0] = NULL;
				if(kNode_IsError(node)) return tokens->endIdx;
				if(nextIdx != PatternNoMatch) {
					tokenIdx = nextIdx;
				}
			}
			else {
				if(ruleToken->symbol != tk->symbol) {
					errRuleRef[0] = ruleToken;
					return PatternNoMatch;
				}
				if(ruleToken->tokenType == KSymbol_ParenthesisGroup || ruleToken->tokenType == KSymbol_BracketGroup) {
					KTokenSeq nrule = {ns, RangeGroup(ruleToken->GroupTokenList)};
					KTokenSeq ntokens = {ns, RangeGroup(tk->GroupTokenList)};
					int next = MatchSyntaxPattern(kctx, node, &ntokens, &nrule, errRuleRef);
					if(next == PatternNoMatch) {
						return PatternNoMatch;
					}
				}
				tokenIdx++;
			}
			if(kToken_Is(MatchPreviousPattern, ruleToken)) {
				goto L_ReDo;
			}
		}
		else { /* tokenIdx < patterns->endIdx */
			while(patternIdx + 1 < patterns->endIdx) {
				if(ruleToken->symbol != KSymbol_OptionalGroup && !kToken_Is(MatchPreviousPattern,ruleToken)) {
					errRuleRef[0] = ruleToken;
					errRuleRef[1] = NULL;
					return -1;
				}
				patternIdx++;
				ruleToken = patterns->tokenList->TokenItems[patternIdx];
			}
			return tokenIdx;
		}
	}
	return tokenIdx;
}